

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperMatch.c
# Opt level: O3

void Map_NodeTransferArrivalTimes(Map_Man_t *p,Map_Node_t *pNode)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Map_Cut_t *pMVar9;
  Map_Cut_t *pMVar10;
  float fVar11;
  ulong uVar12;
  float fVar13;
  
  pMVar9 = pNode->pCutBest[0];
  pMVar10 = pNode->pCutBest[1];
  if (pMVar9 == (Map_Cut_t *)0x0) {
    if (pMVar10 != (Map_Cut_t *)0x0) {
      pNode->tArrival[1].Worst = pMVar10->M[1].tArrive.Worst;
      fVar11 = pMVar10->M[1].tArrive.Fall;
      pNode->tArrival[1].Rise = pMVar10->M[1].tArrive.Rise;
      pNode->tArrival[1].Fall = fVar11;
      uVar1 = pNode->tArrival[1].Rise;
      uVar5 = pNode->tArrival[1].Fall;
      uVar2 = (p->pSuperLib->tDelayInv).Rise;
      uVar6 = (p->pSuperLib->tDelayInv).Fall;
      fVar11 = (float)uVar2 + (float)uVar5;
      fVar13 = (float)uVar6 + (float)uVar1;
      uVar12 = CONCAT44(fVar13,fVar11);
      pNode->tArrival[0].Rise = fVar11;
      pNode->tArrival[0].Fall = fVar13;
      if (fVar11 <= fVar13) {
        uVar12 = (ulong)(uint)fVar13;
      }
      pNode->tArrival[0].Worst = (float)uVar12;
      return;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperMatch.c"
                  ,0x21b,"void Map_NodeTransferArrivalTimes(Map_Man_t *, Map_Node_t *)");
  }
  pNode->tArrival[0].Worst = pMVar9->M[0].tArrive.Worst;
  fVar11 = pMVar9->M[0].tArrive.Fall;
  pNode->tArrival[0].Rise = pMVar9->M[0].tArrive.Rise;
  pNode->tArrival[0].Fall = fVar11;
  if (pMVar10 != (Map_Cut_t *)0x0) {
    pNode->tArrival[1].Worst = pMVar10->M[1].tArrive.Worst;
    fVar11 = pMVar10->M[1].tArrive.Fall;
    pNode->tArrival[1].Rise = pMVar10->M[1].tArrive.Rise;
    pNode->tArrival[1].Fall = fVar11;
    return;
  }
  uVar3 = pNode->tArrival[0].Rise;
  uVar7 = pNode->tArrival[0].Fall;
  uVar4 = (p->pSuperLib->tDelayInv).Rise;
  uVar8 = (p->pSuperLib->tDelayInv).Fall;
  fVar11 = (float)uVar4 + (float)uVar7;
  fVar13 = (float)uVar8 + (float)uVar3;
  uVar12 = CONCAT44(fVar13,fVar11);
  pNode->tArrival[1].Rise = fVar11;
  pNode->tArrival[1].Fall = fVar13;
  if (fVar11 <= fVar13) {
    uVar12 = (ulong)(uint)fVar13;
  }
  pNode->tArrival[1].Worst = (float)uVar12;
  return;
}

Assistant:

void Map_NodeTransferArrivalTimes( Map_Man_t * p, Map_Node_t * pNode )
{
    // if both phases are available, set their arrival times
    if ( pNode->pCutBest[0] && pNode->pCutBest[1] )
    {
        pNode->tArrival[0] = pNode->pCutBest[0]->M[0].tArrive;
        pNode->tArrival[1] = pNode->pCutBest[1]->M[1].tArrive;
    }
    // if only one phase is available, compute the arrival time of other phase
    else if ( pNode->pCutBest[0] )
    {
        pNode->tArrival[0] = pNode->pCutBest[0]->M[0].tArrive;
        pNode->tArrival[1].Rise  = pNode->tArrival[0].Fall + p->pSuperLib->tDelayInv.Rise;
        pNode->tArrival[1].Fall  = pNode->tArrival[0].Rise + p->pSuperLib->tDelayInv.Fall;
        pNode->tArrival[1].Worst = MAP_MAX(pNode->tArrival[1].Rise, pNode->tArrival[1].Fall);
    }
    else if ( pNode->pCutBest[1] )
    {
        pNode->tArrival[1] = pNode->pCutBest[1]->M[1].tArrive;
        pNode->tArrival[0].Rise  = pNode->tArrival[1].Fall + p->pSuperLib->tDelayInv.Rise;
        pNode->tArrival[0].Fall  = pNode->tArrival[1].Rise + p->pSuperLib->tDelayInv.Fall;
        pNode->tArrival[0].Worst = MAP_MAX(pNode->tArrival[0].Rise, pNode->tArrival[0].Fall);
    }
    else 
    {
        assert( 0 );
    }

//    assert( pNode->tArrival[0].Rise < pNode->tRequired[0].Rise + p->fEpsilon );
//    assert( pNode->tArrival[0].Fall < pNode->tRequired[0].Fall + p->fEpsilon );

//    assert( pNode->tArrival[1].Rise < pNode->tRequired[1].Rise + p->fEpsilon );
//    assert( pNode->tArrival[1].Fall < pNode->tRequired[1].Fall + p->fEpsilon );
}